

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonparser.cpp
# Opt level: O0

bool __thiscall QJsonPrivate::Parser::parseArray(Parser *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  QCborContainerPrivate *o;
  QCborContainerPrivate *in_RDI;
  char token;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffef;
  QCborContainerPrivate *this_00;
  bool local_1;
  
  iVar3 = *(int *)&(in_RDI->data).d.ptr + 1;
  *(int *)&(in_RDI->data).d.ptr = iVar3;
  if (iVar3 < 0x401) {
    this_00 = in_RDI;
    bVar1 = eatSpace((Parser *)in_RDI);
    if (bVar1) {
      if (*(char *)in_RDI->usedData == ']') {
        nextToken((Parser *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8));
LAB_001b4cf4:
        *(int *)&(in_RDI->data).d.ptr = *(int *)&(in_RDI->data).d.ptr + -1;
        local_1 = true;
      }
      else {
        while (bVar1 = eatSpace((Parser *)in_RDI), bVar1) {
          bVar1 = QExplicitlySharedDataPointer<QCborContainerPrivate>::operator!
                            ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x1b4c55);
          if (bVar1) {
            o = (QCborContainerPrivate *)operator_new(0x40);
            QCborContainerPrivate::QCborContainerPrivate(in_RDI);
            QExplicitlySharedDataPointer<QCborContainerPrivate>::operator=
                      ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)in_RDI,o);
          }
          bVar1 = parseValueIntoContainer((Parser *)this_00);
          if (!bVar1) {
            return false;
          }
          cVar2 = nextToken((Parser *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8))
          ;
          if (cVar2 == ']') goto LAB_001b4cf4;
          if (cVar2 != ',') {
            bVar1 = eatSpace((Parser *)in_RDI);
            if (bVar1) {
              *(undefined4 *)((long)&(in_RDI->data).d.ptr + 4) = 4;
            }
            else {
              *(undefined4 *)((long)&(in_RDI->data).d.ptr + 4) = 3;
            }
            return false;
          }
          in_stack_ffffffffffffffef = 0x2c;
        }
        *(ParseError *)((long)&(in_RDI->data).d.ptr + 4) = UnterminatedArray;
        local_1 = false;
      }
    }
    else {
      *(ParseError *)((long)&(in_RDI->data).d.ptr + 4) = UnterminatedArray;
      local_1 = false;
    }
  }
  else {
    *(ParseError *)((long)&(in_RDI->data).d.ptr + 4) = DeepNesting;
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Parser::parseArray()
{
    if (++nestingLevel > nestingLimit) {
        lastError = QJsonParseError::DeepNesting;
        return false;
    }

    if (!eatSpace()) {
        lastError = QJsonParseError::UnterminatedArray;
        return false;
    }
    if (*json == EndArray) {
        nextToken();
    } else {
        while (1) {
            if (!eatSpace()) {
                lastError = QJsonParseError::UnterminatedArray;
                return false;
            }
            if (!container)
                container = new QCborContainerPrivate;

            if (!parseValueIntoContainer())
                return false;

            char token = nextToken();
            if (token == EndArray)
                break;
            else if (token != ValueSeparator) {
                if (!eatSpace())
                    lastError = QJsonParseError::UnterminatedArray;
                else
                    lastError = QJsonParseError::MissingValueSeparator;
                return false;
            }
        }
    }

    --nestingLevel;

    return true;
}